

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::flush_every(registry *this,seconds interval)

{
  periodic_worker *this_00;
  pointer __p;
  __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::mutex::lock(&this->flusher_mutex_);
  this_00 = (periodic_worker *)operator_new(0x68);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/details/registry-inl.h:194:17)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/details/registry-inl.h:194:17)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  periodic_worker::periodic_worker(this_00,(function<void_()> *)&local_40,interval);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_48._M_t.
  super__Tuple_impl<0UL,_spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
  .super__Head_base<0UL,_spdlog::details::periodic_worker_*,_false>._M_head_impl =
       (tuple<spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
        )(_Tuple_impl<0UL,_spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
          )0x0;
  std::
  __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::reset((__uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
           *)&this->periodic_flusher_,this_00);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::~unique_ptr((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
                 *)&local_48);
  pthread_mutex_unlock((pthread_mutex_t *)&this->flusher_mutex_);
  return;
}

Assistant:

SPDLOG_INLINE void registry::flush_every(std::chrono::seconds interval)
{
    std::lock_guard<std::mutex> lock(flusher_mutex_);
    auto clbk = [this]() { this->flush_all(); };
    periodic_flusher_ = details::make_unique<periodic_worker>(clbk, interval);
}